

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

Promise<void> __thiscall
kj::Promise<void>::attach<kj::Own<kj::AsyncInputStream>,kj::String,kj::Own<kj::HttpHeaders>>
          (Promise<void> *this,Own<kj::AsyncInputStream> *attachments,String *attachments_1,
          Own<kj::HttpHeaders> *attachments_2)

{
  PromiseNode *pPVar1;
  PromiseNode *extraout_RDX;
  undefined8 *in_R8;
  Promise<void> PVar2;
  Disposer *local_58;
  PromiseNode *pPStack_50;
  TupleImpl<kj::_::Indexes<0UL,_1UL,_2UL>,_kj::Own<kj::AsyncInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>
  local_48;
  
  local_48.super_TupleElement<0U,_kj::Own<kj::AsyncInputStream>_>.value.disposer =
       (Disposer *)(attachments_1->content).ptr;
  local_48.super_TupleElement<0U,_kj::Own<kj::AsyncInputStream>_>.value.ptr =
       (AsyncInputStream *)(attachments_1->content).size_;
  (attachments_1->content).size_ = 0;
  local_48.super_TupleElement<1U,_kj::String>.value.content.ptr = (char *)attachments_2->disposer;
  local_48.super_TupleElement<1U,_kj::String>.value.content.size_ = (size_t)attachments_2->ptr;
  local_48.super_TupleElement<1U,_kj::String>.value.content.disposer =
       (ArrayDisposer *)attachments_2[1].disposer;
  attachments_2->disposer = (Disposer *)0x0;
  attachments_2->ptr = (HttpHeaders *)0x0;
  local_48.super_TupleElement<2U,_kj::Own<kj::HttpHeaders>_>.value.disposer = (Disposer *)*in_R8;
  local_48.super_TupleElement<2U,_kj::Own<kj::HttpHeaders>_>.value.ptr = (HttpHeaders *)in_R8[1];
  in_R8[1] = 0;
  heap<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::AsyncInputStream>,kj::String,kj::Own<kj::HttpHeaders>>>,kj::Own<kj::_::PromiseNode>,kj::_::Tuple<kj::Own<kj::AsyncInputStream>,kj::String,kj::Own<kj::HttpHeaders>>>
            ((kj *)&local_58,(Own<kj::_::PromiseNode> *)attachments,
             (Tuple<kj::Own<kj::AsyncInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_> *)
             &local_48);
  pPVar1 = pPStack_50;
  pPStack_50 = (PromiseNode *)0x0;
  (this->super_PromiseBase).node.disposer = local_58;
  (this->super_PromiseBase).node.ptr = pPVar1;
  _::
  TupleImpl<kj::_::Indexes<0UL,_1UL,_2UL>,_kj::Own<kj::AsyncInputStream>,_kj::String,_kj::Own<kj::HttpHeaders>_>
  ::~TupleImpl(&local_48);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar2.super_PromiseBase.node;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false, kj::heap<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
      kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}